

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O1

size_t __thiscall MutableS2ShapeIndex::SpaceUsed(MutableS2ShapeIndex *this)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
  *pvVar4;
  uint uVar5;
  atomic<const_S2ShapeIndexCell_*> this_00;
  size_type sVar6;
  size_t sVar7;
  const_reference pvVar8;
  uint uVar9;
  long lVar10;
  size_type_conflict n;
  const_iterator cVar11;
  Iterator local_78;
  MutableS2ShapeIndex *local_38;
  
  puVar2 = (this->shapes_).
           super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar3 = (this->shapes_).
           super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar6 = gtl::internal_btree::
          btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
          ::bytes_used((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                        *)&this->cell_map_);
  lVar10 = (this->cell_map_).
           super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
           .
           super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
           .
           super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
           .tree_.size_;
  local_78.super_IteratorBase.id_.id_ = 0xffffffffffffffff;
  local_78.super_IteratorBase.cell_._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_78.super_IteratorBase._vptr_IteratorBase = (_func_int **)&PTR__IteratorBase_002c10d0;
  local_78.iter_.node =
       (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
        *)0x0;
  local_78.iter_.position = -1;
  local_78.end_.node =
       (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
        *)0x0;
  local_78.end_.position = -1;
  local_78.index_ = this;
  cVar11 = gtl::internal_btree::
           btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
           ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                  *)&this->cell_map_);
  local_78.end_.node = cVar11.node;
  local_78.end_.position = cVar11.position;
  local_78.iter_.node =
       gtl::internal_btree::
       btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
       ::leftmost((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                   *)&(local_78.index_)->cell_map_);
  local_78.iter_.position = 0;
  if ((local_78.iter_.node == local_78.end_.node) && (local_78.end_.position == 0)) {
    local_78.super_IteratorBase.id_.id_ = 0xffffffffffffffff;
    local_78.super_IteratorBase.cell_._M_b._M_p = (__base_type)(__pointer_type)0x0;
  }
  else {
    if (((ulong)local_78.iter_.node & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                    ,0x1e1,
                    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                   );
    }
    local_78.super_IteratorBase.id_.id_ = *(uint64 *)(local_78.iter_.node + 0x10);
    local_78.super_IteratorBase.cell_._M_b._M_p = *(__base_type *)(local_78.iter_.node + 0x18);
  }
  sVar7 = (long)puVar2 + lVar10 * 0x10 + (sVar6 - (long)puVar3) + 0x40;
  local_38 = this;
  if (local_78.super_IteratorBase.id_.id_ != 0xffffffffffffffff) {
    do {
      this_00._M_b._M_p = local_78.super_IteratorBase.cell_._M_b._M_p;
      uVar1 = *(uint *)local_78.super_IteratorBase.cell_._M_b._M_p;
      uVar9 = uVar1 >> 0x18 & 0x3f;
      uVar5 = 1 << ((byte)uVar9 & 0x1f);
      if ((uVar1 >> 0x1e & 1) == 0) {
        uVar5 = uVar9;
      }
      sVar7 = (ulong)uVar5 * 0x10 + sVar7;
      if ((uVar1 & 0xffffff) != 0) {
        n = 0;
        do {
          pvVar8 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                   operator[]((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *
                              )this_00._M_b._M_p,n);
          lVar10 = (ulong)(*(uint *)&pvVar8->field_0x4 >> 1) << 2;
          if (*(uint *)&pvVar8->field_0x4 < 6) {
            lVar10 = 0;
          }
          sVar7 = sVar7 + lVar10;
          n = n + 1;
        } while (n < (*(uint *)this_00._M_b._M_p & 0xffffff));
      }
      Iterator::Next(&local_78);
    } while (local_78.super_IteratorBase.id_.id_ != 0xffffffffffffffff);
  }
  pvVar4 = (local_38->pending_removals_)._M_t.
           super___uniq_ptr_impl<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_*,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
           .
           super__Head_base<0UL,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_*,_false>
           ._M_head_impl;
  if (pvVar4 != (vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                 *)0x0) {
    sVar7 = (long)*(pointer *)
                   ((long)&(pvVar4->
                           super__Vector_base<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                           )._M_impl + 0x10) +
            (sVar7 - *(long *)&(pvVar4->
                               super__Vector_base<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
                               )._M_impl);
  }
  return sVar7;
}

Assistant:

size_t MutableS2ShapeIndex::SpaceUsed() const {
  size_t size = sizeof(*this);
  size += shapes_.capacity() * sizeof(std::unique_ptr<S2Shape>);
  // cell_map_ itself is already included in sizeof(*this).
  size += cell_map_.bytes_used() - sizeof(cell_map_);
  size += cell_map_.size() * sizeof(S2ShapeIndexCell);
  Iterator it;
  for (it.InitStale(this, S2ShapeIndex::BEGIN); !it.done(); it.Next()) {
    const S2ShapeIndexCell& cell = it.cell();
    size += cell.shapes_.capacity() * sizeof(S2ClippedShape);
    for (int s = 0; s < cell.num_clipped(); ++s) {
      const S2ClippedShape& clipped = cell.clipped(s);
      if (!clipped.is_inline()) {
        size += clipped.num_edges() * sizeof(int32);
      }
    }
  }
  if (pending_removals_ != nullptr) {
    size += pending_removals_->capacity() * sizeof(RemovedShape);
  }

  return size;
}